

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O2

int x86IMUL(uchar *stream,x86Reg dst,x86Size size,x86Reg index,int multiplier,x86Reg base,int shift)

{
  uchar *puVar1;
  uint uVar2;
  
  if (size - sDWORD < 2) {
    uVar2 = encodeRex(stream,size == sQWORD,dst,index,base);
    puVar1 = stream + uVar2;
    puVar1[0] = '\x0f';
    puVar1[1] = 0xaf;
    uVar2 = encodeAddress(puVar1 + 2,index,multiplier,base,shift,(int)regCode[dst]);
    return (uVar2 + (int)(puVar1 + 2)) - (int)stream;
  }
  __assert_fail("size == sDWORD || size == sQWORD",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                ,0x5da,"int x86IMUL(unsigned char *, x86Reg, x86Size, x86Reg, int, x86Reg, int)");
}

Assistant:

int x86IMUL(unsigned char *stream, x86Reg dst, x86Size size, x86Reg index, int multiplier, x86Reg base, int shift)
{
	unsigned char *start = stream;

	assert(size == sDWORD || size == sQWORD);

	stream += encodeRex(stream, size == sQWORD, dst, index, base);
	*stream++ = 0x0f;
	*stream++ = 0xaf;
	stream += encodeAddress(stream, index, multiplier, base, shift, regCode[dst]);

	return int(stream - start);
}